

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLp.cpp
# Opt level: O1

void __thiscall
HighsLp::deleteRowsFromVectors
          (HighsLp *this,HighsInt *new_num_row,HighsIndexCollection *index_collection)

{
  int iVar1;
  int iVar2;
  pointer pdVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  HighsInt keep_to_row;
  HighsInt to_k;
  HighsInt current_set_entry;
  HighsInt keep_from_row;
  HighsInt delete_to_row;
  HighsInt delete_from_row;
  HighsInt from_k;
  HighsInt local_5c;
  int local_58;
  HighsInt local_54;
  int local_50;
  int local_4c;
  HighsInt local_48;
  uint local_44;
  HighsIndexCollection *local_40;
  ulong local_38;
  
  limits(index_collection,(HighsInt *)&local_44,&local_58);
  *new_num_row = this->num_row_;
  if ((int)local_44 <= local_58) {
    local_5c = -1;
    local_54 = 0;
    iVar1 = this->num_row_;
    *new_num_row = 0;
    iVar5 = (int)((ulong)((long)(this->row_names_).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->row_names_).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 5);
    if ((int)local_44 <= local_58) {
      iVar1 = iVar1 + -1;
      uVar4 = local_44;
      local_40 = index_collection;
      while( true ) {
        updateOutInIndex(index_collection,&local_48,&local_4c,&local_50,&local_5c,&local_54);
        if (uVar4 == local_44) {
          *new_num_row = local_48;
        }
        if (iVar1 <= local_4c) break;
        local_38 = (ulong)uVar4;
        if (local_50 <= local_5c) {
          lVar6 = (long)local_50 + -1;
          do {
            pdVar3 = (this->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            iVar2 = *new_num_row;
            pdVar3[iVar2] = pdVar3[lVar6 + 1];
            pdVar3 = (this->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar3[iVar2] = pdVar3[lVar6 + 1];
            if (0 < iVar5) {
              std::__cxx11::string::_M_assign
                        ((string *)
                         ((this->row_names_).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + iVar2));
            }
            *new_num_row = *new_num_row + 1;
            lVar6 = lVar6 + 1;
            index_collection = local_40;
          } while (lVar6 < local_5c);
        }
        if ((iVar1 <= local_5c) || (uVar4 = (int)local_38 + 1, local_58 <= (int)local_38)) break;
      }
    }
    std::vector<double,_std::allocator<double>_>::resize(&this->row_lower_,(long)*new_num_row);
    std::vector<double,_std::allocator<double>_>::resize(&this->row_upper_,(long)*new_num_row);
    if (0 < iVar5) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::resize(&this->row_names_,(long)*new_num_row);
    }
  }
  return;
}

Assistant:

void HighsLp::deleteRowsFromVectors(
    HighsInt& new_num_row, const HighsIndexCollection& index_collection) {
  assert(ok(index_collection));
  HighsInt from_k;
  HighsInt to_k;
  limits(index_collection, from_k, to_k);
  // Initialise new_num_row in case none is removed due to from_k > to_k
  new_num_row = this->num_row_;
  if (from_k > to_k) return;

  HighsInt delete_from_row;
  HighsInt delete_to_row;
  HighsInt keep_from_row;
  HighsInt keep_to_row = -1;
  HighsInt current_set_entry = 0;

  HighsInt row_dim = this->num_row_;
  new_num_row = 0;
  bool have_names = (HighsInt)this->row_names_.size() > 0;
  for (HighsInt k = from_k; k <= to_k; k++) {
    updateOutInIndex(index_collection, delete_from_row, delete_to_row,
                     keep_from_row, keep_to_row, current_set_entry);
    if (k == from_k) {
      // Account for the initial rows being kept
      new_num_row = delete_from_row;
    }
    if (delete_to_row >= row_dim - 1) break;
    assert(delete_to_row < row_dim);
    for (HighsInt row = keep_from_row; row <= keep_to_row; row++) {
      this->row_lower_[new_num_row] = this->row_lower_[row];
      this->row_upper_[new_num_row] = this->row_upper_[row];
      if (have_names) this->row_names_[new_num_row] = this->row_names_[row];
      new_num_row++;
    }
    if (keep_to_row >= row_dim - 1) break;
  }
  this->row_lower_.resize(new_num_row);
  this->row_upper_.resize(new_num_row);
  if (have_names) this->row_names_.resize(new_num_row);
}